

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O3

void __thiscall
FuzzingParameterSet::set_distribution
          (FuzzingParameterSet *this,Range<int> range_N_sided,
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *probabilities)

{
  int iVar1;
  bool bVar2;
  void *pvVar3;
  const_iterator cVar4;
  iterator iVar5;
  undefined8 uVar6;
  param_type local_88;
  FuzzingParameterSet *local_58;
  int local_4c;
  undefined1 auStack_48 [8];
  vector<int,_std::allocator<int>_> dd;
  
  auStack_48 = (undefined1  [8])0x0;
  dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  if (-1 < range_N_sided.max) {
    local_58 = this;
    do {
      cVar4 = std::
              _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&probabilities->_M_h,(key_type_conflict *)&local_88);
      if (cVar4.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
          (__node_type *)0x0) {
        local_4c = 0;
      }
      else {
        iVar5 = std::
                _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&probabilities->_M_h,(key_type_conflict *)&local_88);
        if (iVar5.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
            (__node_type *)0x0) {
          uVar6 = std::__throw_out_of_range("_Map_base::at");
          if (auStack_48 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_48,
                            (long)dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)auStack_48);
          }
          _Unwind_Resume(uVar6);
        }
        local_4c = *(int *)((long)iVar5.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                  _M_cur + 0xc);
      }
      if (dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          == dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_48,
                   (iterator)
                   dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start,&local_4c);
      }
      else {
        *dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             local_4c;
        dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
      }
      iVar1 = (int)local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      bVar2 = (int)local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start < range_N_sided.max;
      this = local_58;
      local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = iVar1;
    } while (bVar2);
  }
  std::discrete_distribution<int>::param_type::
  param_type<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)auStack_48
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
              dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)&this->N_sided_probabilities,
             &local_88._M_prob);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(this->N_sided_probabilities)._M_param._M_cp,&local_88._M_cp);
  if (local_88._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT44(local_88._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_88._M_prob.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_88._M_prob.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)dd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

void FuzzingParameterSet::set_distribution(Range<int> range_N_sided, std::unordered_map<int, int> probabilities) {
  std::vector<int> dd;
  for (int i = 0; i <= range_N_sided.max; i += 1) {
    dd.push_back((probabilities.count(i) > 0) ? probabilities.at(i) : (int) 0);
  }
  N_sided_probabilities = std::discrete_distribution<int>(dd.begin(), dd.end());
}